

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdPlugin.c
# Opt level: O0

int Cmd_CommandAbcPlugIn(Abc_Frame_t *pAbc,int argc,char **argv)

{
  FILE *p;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  char *pcVar6;
  abctime aVar7;
  abctime aVar8;
  FILE *__stream;
  int *pArray;
  Abc_Cex_t *pAVar9;
  Gia_Man_t *pGVar10;
  Vec_Int_t *vTemp;
  int nRemain;
  int nFrames;
  int fLeaveFiles;
  abctime clk;
  int fd;
  int i;
  Gia_Man_t *pGia;
  FILE *pFile;
  Vec_Int_t *vCex;
  Vec_Str_t *vCommand;
  char *pFileOut;
  char *pFileIn;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pFileIn = (char *)argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  if (pAbc->pGia == (Gia_Man_t *)0x0) {
    if ((argc == 2) && (iVar1 = strcmp(argv[1],"-h"), iVar1 == 0)) {
      pVVar5 = (Vec_Int_t *)Vec_StrAlloc(100);
      vCex = pVVar5;
      pcVar6 = Abc_GetBinaryName(pAStack_18,argv_local._4_4_,(char **)pFileIn);
      Vec_StrAppend((Vec_Str_t *)pVVar5,pcVar6);
      Vec_StrAppend((Vec_Str_t *)vCex," -abc ");
      Vec_StrAppend((Vec_Str_t *)vCex,*(char **)pFileIn);
      Vec_StrAppend((Vec_Str_t *)vCex," -h");
      Vec_StrPush((Vec_Str_t *)vCex,'\0');
      pcVar6 = Vec_StrArray((Vec_Str_t *)vCex);
      Util_SignalSystem(pcVar6);
      Vec_StrFree((Vec_Str_t *)vCex);
    }
    else {
      Abc_Print(-1,"Current AIG does not exist (try command &ps).\n");
    }
    pAbc_local._4_4_ = 1;
  }
  else {
    iVar1 = Util_SignalTmpFile("__abctmp_",".aig",&pFileOut);
    if (iVar1 == -1) {
      Abc_Print(-1,"Cannot create a temporary file.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      close(iVar1);
      iVar1 = Util_SignalTmpFile("__abctmp_",".out",(char **)&vCommand);
      if (iVar1 == -1) {
        if (pFileOut != (char *)0x0) {
          free(pFileOut);
          pFileOut = (char *)0x0;
        }
        Abc_Print(-1,"Cannot create a temporary file.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        close(iVar1);
        iVar1 = strcmp(*(char **)(pFileIn + (long)(argv_local._4_4_ + -1) * 8),"!");
        if (iVar1 == 0) {
          Abc_Print(0,"Input file \"%s\" and output file \"%s\" are not deleted.\n",pFileOut);
          argv_local._4_4_ = argv_local._4_4_ + -1;
        }
        nRemain = (int)(iVar1 == 0);
        Gia_AigerWrite(pAStack_18->pGia,pFileOut,0,0);
        pVVar5 = (Vec_Int_t *)Vec_StrAlloc(100);
        vCex = pVVar5;
        pcVar6 = Abc_GetBinaryName(pAStack_18,argv_local._4_4_,(char **)pFileIn);
        Vec_StrAppend((Vec_Str_t *)pVVar5,pcVar6);
        Vec_StrAppend((Vec_Str_t *)vCex," -abc");
        Vec_StrAppend((Vec_Str_t *)vCex," -input=");
        Vec_StrAppend((Vec_Str_t *)vCex,pFileOut);
        Vec_StrAppend((Vec_Str_t *)vCex," -output=");
        Vec_StrAppend((Vec_Str_t *)vCex,(char *)vCommand);
        for (clk._4_4_ = 0; clk._4_4_ < argv_local._4_4_; clk._4_4_ = clk._4_4_ + 1) {
          Vec_StrAppend((Vec_Str_t *)vCex," ");
          Vec_StrAppend((Vec_Str_t *)vCex,*(char **)(pFileIn + (long)clk._4_4_ * 8));
        }
        Vec_StrPush((Vec_Str_t *)vCex,'\0');
        aVar7 = Abc_Clock();
        pcVar6 = Vec_StrArray((Vec_Str_t *)vCex);
        iVar1 = Util_SignalSystem(pcVar6);
        if (iVar1 == 0) {
          aVar8 = Abc_Clock();
          Vec_StrFree((Vec_Str_t *)vCex);
          __stream = fopen((char *)vCommand,"r");
          if (__stream == (FILE *)0x0) {
            Abc_Print(-1,"There is no output file \"%s\".\n",vCommand);
            pAbc_local._4_4_ = 1;
          }
          else {
            fclose(__stream);
            iVar1 = Extra_FileSize((char *)vCommand);
            if (0 < iVar1) {
              iVar1 = Abc_ManReadStatus((char *)vCommand,"result:");
              pAStack_18->Status = iVar1;
              iVar1 = Abc_ManReadInteger((char *)vCommand,"bug-free-depth:");
              pAStack_18->nFrames = iVar1;
              pVVar5 = Abc_ManReadBinary((char *)vCommand,"abstraction:");
              pAStack_18->pGia->vFlopClasses = pVVar5;
              pFile = (FILE *)Abc_ManReadBinary((char *)vCommand,"counter-example:");
              if (pFile != (FILE *)0x0) {
                Vec_IntSize((Vec_Int_t *)pFile);
                Gia_ManRegNum(pAStack_18->pGia);
                Gia_ManPiNum(pAStack_18->pGia);
                iVar1 = Vec_IntSize((Vec_Int_t *)pFile);
                iVar2 = Gia_ManRegNum(pAStack_18->pGia);
                iVar3 = Gia_ManPiNum(pAStack_18->pGia);
                if ((iVar1 - iVar2) % iVar3 != 0) {
                  Abc_Print(1,"Adjusting counter-example by adding zeros for PIs without fanout.\n")
                  ;
                  p = pFile;
                  pFile = (FILE *)Abc_ManExpandCex(pAStack_18->pGia,(Vec_Int_t *)pFile);
                  Vec_IntFree((Vec_Int_t *)p);
                }
                iVar1 = Vec_IntSize((Vec_Int_t *)pFile);
                iVar2 = Gia_ManRegNum(pAStack_18->pGia);
                iVar3 = Gia_ManPiNum(pAStack_18->pGia);
                iVar3 = (iVar1 - iVar2) / iVar3;
                iVar1 = Vec_IntSize((Vec_Int_t *)pFile);
                iVar2 = Gia_ManRegNum(pAStack_18->pGia);
                iVar4 = Gia_ManPiNum(pAStack_18->pGia);
                if ((iVar1 - iVar2) % iVar4 == 0) {
                  Abc_Print(1,"Problem is satisfiable. Found counter-example in frame %d.  ",
                            (ulong)(iVar3 - 1));
                  Abc_PrintTime(1,"Time",aVar8 - aVar7);
                  if (pAStack_18->pCex != (Abc_Cex_t *)0x0) {
                    free(pAStack_18->pCex);
                    pAStack_18->pCex = (Abc_Cex_t *)0x0;
                  }
                  iVar1 = Gia_ManRegNum(pAStack_18->pGia);
                  iVar2 = Gia_ManPiNum(pAStack_18->pGia);
                  pArray = Vec_IntArray((Vec_Int_t *)pFile);
                  pAVar9 = Abc_CexCreate(iVar1,iVar2,pArray,iVar3 + -1,0,0);
                  pAStack_18->pCex = pAVar9;
                  iVar1 = Gia_ManFindFailedPoCex(pAStack_18->pGia,pAStack_18->pCex,0);
                  pAStack_18->pCex->iPo = iVar1;
                  if (pAStack_18->pCex->iPo == -1) {
                    Abc_Print(1,"Generated counter-example is INVALID.\n");
                    if (pAStack_18->pCex != (Abc_Cex_t *)0x0) {
                      free(pAStack_18->pCex);
                      pAStack_18->pCex = (Abc_Cex_t *)0x0;
                    }
                  }
                  else {
                    Abc_Print(1,"Returned counter-example successfully verified in ABC.\n");
                  }
                }
                else {
                  Abc_Print(1,"Counter example has a wrong length.\n");
                }
                Vec_IntFreeP((Vec_Int_t **)&pFile);
              }
              pGVar10 = Abc_ManReadAig((char *)vCommand,"aig:");
              if (pGVar10 != (Gia_Man_t *)0x0) {
                Gia_ManStopP(&pAStack_18->pGia);
                pAStack_18->pGia = pGVar10;
              }
            }
            Util_SignalTmpFileRemove(pFileOut,nRemain);
            Util_SignalTmpFileRemove((char *)vCommand,nRemain);
            if (pFileOut != (char *)0x0) {
              free(pFileOut);
              pFileOut = (char *)0x0;
            }
            if (vCommand != (Vec_Str_t *)0x0) {
              free(vCommand);
            }
            pAbc_local._4_4_ = 0;
          }
        }
        else {
          Abc_Print(-1,"The following command has returned non-zero exit status:\n");
          pcVar6 = Vec_StrArray((Vec_Str_t *)vCex);
          Abc_Print(-1,"\"%s\"\n",pcVar6);
          pAbc_local._4_4_ = 1;
        }
      }
    }
  }
  return pAbc_local._4_4_;
}

Assistant:

int Cmd_CommandAbcPlugIn( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char * pFileIn, * pFileOut;
    Vec_Str_t * vCommand;
    Vec_Int_t * vCex;
    FILE * pFile;
    Gia_Man_t * pGia;
    int i, fd;
    abctime clk;
    int fLeaveFiles;
/*
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Current network does not exist\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash( pNtk) )
    {
        Abc_Print( -1, "The current network is not an AIG. Cannot continue.\n" );
        return 1;
    }
*/

    if ( pAbc->pGia == NULL )
    {
        if (argc == 2 && strcmp(argv[1], "-h") == 0)
        {
            // Run command to produce help string:
            vCommand = Vec_StrAlloc( 100 );
            Vec_StrAppend( vCommand, Abc_GetBinaryName( pAbc, argc, argv ) );
            Vec_StrAppend( vCommand, " -abc " );
            Vec_StrAppend( vCommand, argv[0] );
            Vec_StrAppend( vCommand, " -h" );
            Vec_StrPush( vCommand, 0 );
            Util_SignalSystem( Vec_StrArray(vCommand) );
            Vec_StrFree( vCommand );
        }
        else
        {
            Abc_Print( -1, "Current AIG does not exist (try command &ps).\n" );
        }
        return 1;
    }

    // create temp file
    fd = Util_SignalTmpFile( "__abctmp_", ".aig", &pFileIn );
    if ( fd == -1 )
    {
        Abc_Print( -1, "Cannot create a temporary file.\n" );
        return 1;
    }
#ifdef WIN32
    _close( fd );
#else
    close( fd );
#endif

    // create temp file
    fd = Util_SignalTmpFile( "__abctmp_", ".out", &pFileOut );
    if ( fd == -1 )
    {
        ABC_FREE( pFileIn );
        Abc_Print( -1, "Cannot create a temporary file.\n" );
        return 1;
    }
#ifdef WIN32
    _close( fd );
#else
    close( fd );
#endif


    // write current network into a file
/*
    {
        extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
        Aig_Man_t * pAig;
        pAig = Abc_NtkToDar( pNtk, 0, 1 );
        Ioa_WriteAiger( pAig, pFileIn, 0, 0 );
        Aig_ManStop( pAig );
    }
*/ 
    // check what to do with the files
    fLeaveFiles = 0;
    if ( strcmp( argv[argc-1], "!" ) == 0 )
    {
        Abc_Print( 0, "Input file \"%s\" and output file \"%s\" are not deleted.\n", pFileIn, pFileOut );
        fLeaveFiles = 1;
        argc--;
    }

    // create input file
    Gia_AigerWrite( pAbc->pGia, pFileIn, 0, 0 );

    // create command line
    vCommand = Vec_StrAlloc( 100 );
    Vec_StrAppend( vCommand, Abc_GetBinaryName( pAbc, argc, argv ) );
    // add input/output file
    Vec_StrAppend( vCommand, " -abc" );
//    Vec_StrAppend( vCommand, " -input=C:/_projects/abc/_TEST/hwmcc/139442p0.aig" );
    Vec_StrAppend( vCommand, " -input=" );
    Vec_StrAppend( vCommand, pFileIn );
    Vec_StrAppend( vCommand, " -output=" );
    Vec_StrAppend( vCommand, pFileOut );
    // add other arguments
    for ( i = 0; i < argc; i++ )
    {
        Vec_StrAppend( vCommand, " " );
        Vec_StrAppend( vCommand, argv[i] );
    }
    Vec_StrPush( vCommand, 0 );

    // run the command line
//printf( "Running command line: %s\n", Vec_StrArray(vCommand) ); 

    clk = Abc_Clock();
    if ( Util_SignalSystem( Vec_StrArray(vCommand) ) )
    {
        Abc_Print( -1, "The following command has returned non-zero exit status:\n" );
        Abc_Print( -1, "\"%s\"\n", Vec_StrArray(vCommand) );
        return 1;
    }
    clk = Abc_Clock() - clk;
    Vec_StrFree( vCommand );

    // check if the output file exists
    if ( (pFile = fopen( pFileOut, "r" )) == NULL )
    {
        Abc_Print( -1, "There is no output file \"%s\".\n", pFileOut );
        return 1;
    }
    fclose( pFile );

    // process the output
    if ( Extra_FileSize(pFileOut) > 0 )
    {
        // get status
        pAbc->Status  = Abc_ManReadStatus( pFileOut, "result:" );
        // get bug-free depth
        pAbc->nFrames = Abc_ManReadInteger( pFileOut, "bug-free-depth:" );
        // get abstraction
        pAbc->pGia->vFlopClasses = Abc_ManReadBinary( pFileOut, "abstraction:" );
        // get counter-example
        vCex = Abc_ManReadBinary( pFileOut, "counter-example:" );
        if ( vCex ) 
        {
            int nFrames, nRemain;

            nFrames = (Vec_IntSize(vCex) - Gia_ManRegNum(pAbc->pGia)) / Gia_ManPiNum(pAbc->pGia);
            nRemain = (Vec_IntSize(vCex) - Gia_ManRegNum(pAbc->pGia)) % Gia_ManPiNum(pAbc->pGia);
            if ( nRemain != 0 )
            {   
                Vec_Int_t * vTemp;
                Abc_Print( 1, "Adjusting counter-example by adding zeros for PIs without fanout.\n" );
                // expand the counter-example to include PIs without fanout
                vCex = Abc_ManExpandCex( pAbc->pGia, vTemp = vCex );
                Vec_IntFree( vTemp );
            }

            nFrames = (Vec_IntSize(vCex) - Gia_ManRegNum(pAbc->pGia)) / Gia_ManPiNum(pAbc->pGia);
            nRemain = (Vec_IntSize(vCex) - Gia_ManRegNum(pAbc->pGia)) % Gia_ManPiNum(pAbc->pGia);
            if ( nRemain != 0 )
                Abc_Print( 1, "Counter example has a wrong length.\n" );
            else
            {
                Abc_Print( 1, "Problem is satisfiable. Found counter-example in frame %d.  ", nFrames-1 );
                Abc_PrintTime( 1, "Time", clk );
                ABC_FREE( pAbc->pCex );
                pAbc->pCex = Abc_CexCreate( Gia_ManRegNum(pAbc->pGia), Gia_ManPiNum(pAbc->pGia), Vec_IntArray(vCex), nFrames-1, 0, 0 );

//                Abc_CexPrint( pAbc->pCex );

//                if ( !Gia_ManVerifyCex( pAbc->pGia, pAbc->pCex, 0 ) )
//                    Abc_Print( 1, "Generated counter-example is INVALID.\n" );

                // remporary work-around to detect the output number - October 18, 2010
                pAbc->pCex->iPo = Gia_ManFindFailedPoCex( pAbc->pGia, pAbc->pCex, 0 );
                if ( pAbc->pCex->iPo == -1 )
                {
                    Abc_Print( 1, "Generated counter-example is INVALID.\n" );
                    ABC_FREE( pAbc->pCex );
                }
                else
                {
                    Abc_Print( 1, "Returned counter-example successfully verified in ABC.\n" );
                }
            }
            Vec_IntFreeP( &vCex );
        }
        // get AIG if present
        pGia = Abc_ManReadAig( pFileOut, "aig:" );
        if ( pGia != NULL )
        {
            Gia_ManStopP( &pAbc->pGia );
            pAbc->pGia = pGia;                
        }
    }    

    // clean up
    Util_SignalTmpFileRemove( pFileIn, fLeaveFiles );
    Util_SignalTmpFileRemove( pFileOut, fLeaveFiles );
    
    ABC_FREE( pFileIn );
    ABC_FREE( pFileOut );
    return 0;
}